

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStreamPrivate::ungetChar(QTextStreamPrivate *this,QChar ch)

{
  QChar *pQVar1;
  QString *this_00;
  long lVar2;
  
  this_00 = this->string;
  if (this_00 == (QString *)0x0) {
    lVar2 = this->readBufferOffset;
    this_00 = &this->readBuffer;
    if (lVar2 == 0) goto LAB_002cf968;
    this->readBufferOffset = lVar2 + -1;
  }
  else {
    lVar2 = this->stringOffset;
    if (lVar2 == 0) {
LAB_002cf968:
      QString::prepend(this_00,ch);
      return;
    }
    this->stringOffset = lVar2 + -1;
  }
  pQVar1 = QString::data(this_00);
  pQVar1[lVar2 + -1].ucs = ch.ucs;
  return;
}

Assistant:

inline void QTextStreamPrivate::ungetChar(QChar ch)
{
    if (string) {
        if (stringOffset == 0)
            string->prepend(ch);
        else
            (*string)[--stringOffset] = ch;
        return;
    }

    if (readBufferOffset == 0) {
        readBuffer.prepend(ch);
        return;
    }

    readBuffer[--readBufferOffset] = ch;
}